

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O0

int si_map_sii(int slave)

{
  int iVar1;
  int iVar2;
  int inputs_bo;
  int outputs_bo;
  int Tsize;
  int retVal;
  int slave_local;
  
  outputs_bo = 0;
  printf("PDO mapping according to SII :\n");
  iVar1 = si_siiPDO((uint16)slave,'\x01',
                    (int)*(undefined8 *)((long)slave * 0x148 + 0x118108) + -0x116190,0);
  iVar2 = si_siiPDO((uint16)slave,'\0',
                    (int)*(undefined8 *)((long)slave * 0x148 + 0x118118) + -0x116190,0);
  if ((0 < iVar1) || (0 < iVar2)) {
    outputs_bo = 1;
  }
  return outputs_bo;
}

Assistant:

int si_map_sii(int slave)
{
    int retVal = 0;
    int Tsize, outputs_bo, inputs_bo;

    printf("PDO mapping according to SII :\n");

    outputs_bo = 0;
    inputs_bo = 0;
    /* read the assign RXPDOs */
    Tsize = si_siiPDO(slave, 1, (int)(ec_slave[slave].outputs - (uint8*)&IOmap), outputs_bo );
    outputs_bo += Tsize;
    /* read the assign TXPDOs */
    Tsize = si_siiPDO(slave, 0, (int)(ec_slave[slave].inputs - (uint8*)&IOmap), inputs_bo );
    inputs_bo += Tsize;
    /* found some I/O bits ? */
    if ((outputs_bo > 0) || (inputs_bo > 0))
        retVal = 1;
    return retVal;
}